

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)6>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  reference pcVar3;
  reference copy;
  environment *this;
  element_type *this_00;
  pointer pcVar4;
  SchemeFrame *this_01;
  runtime_error *this_02;
  shared_ptr<implementations::scheme::environment> local_240;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_230;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_228;
  const_iterator env_arg_it;
  shared_ptr<implementations::scheme::environment> local_218;
  undefined1 local_208 [8];
  env_p new_env;
  cell body;
  undefined1 local_148 [8];
  cells tmp;
  cell *arglist;
  allocator<implementations::scheme::cell> local_111;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_110;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_108;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_100;
  cell local_e8;
  undefined1 local_90 [8];
  cells args;
  cell proc;
  SchemeFrame *frame_local;
  const_iterator it_local;
  
  proc.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)frame;
  frame_local = (SchemeFrame *)it._M_current;
  pcVar3 = __gnu_cxx::
           __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
           ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                        *)&frame_local);
  cell::cell((cell *)&args.
                      super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar3);
  __gnu_cxx::
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                *)&frame_local);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::vector
            ((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              *)local_90);
  if ((int)args.
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
    local_108._M_current = (cell *)frame_local;
    local_110._M_current =
         (cell *)std::
                 vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ::cend((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                         *)&proc.env.
                            super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi[0xf]._M_use_count);
    std::allocator<implementations::scheme::cell>::allocator(&local_111);
    std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
    vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
              ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                *)&local_100,local_108,local_110,&local_111);
    (*(code *)proc.list.
              super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&local_e8,&local_100);
    cell::operator=((cell *)&proc.env.
                             super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi[1]._M_use_count,&local_e8);
    cell::~cell(&local_e8);
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector(&local_100);
    std::allocator<implementations::scheme::cell>::~allocator(&local_111);
    it_local._M_current._7_1_ = 1;
  }
  else {
    if ((int)args.
             super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != 4) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Dont know how to run this proc");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tmp.
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
         ::operator[]((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                       *)((long)&proc.val.field_2 + 8),1);
    if ((tmp.
         super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->type == Symbol) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 *)local_90,
                tmp.
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              *)local_148,
             (vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              *)&proc.env.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi[0xf]._M_use_count);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      clear((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *
            )&proc.env.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[0xf]._M_use_count);
      p_Var1 = proc.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 0xf;
      cell::cell((cell *)&body.env.
                          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                 (vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                  *)local_148);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 *)&p_Var1->_M_use_count,
                (value_type *)
                &body.env.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
      cell::~cell((cell *)&body.env.
                           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               *)local_148);
    }
    else if ((tmp.
              super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->type == List) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      operator=((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 *)local_90,
                &(tmp.
                  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->list);
    }
    copy = std::
           vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
           operator[]((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                       *)((long)&proc.val.field_2 + 8),2);
    cell::cell((cell *)&new_env.
                        super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,copy);
    this = (environment *)operator_new(0x98);
    env_arg_it._M_current._7_1_ = 1;
    std::shared_ptr<implementations::scheme::environment>::shared_ptr
              (&local_218,(shared_ptr<implementations::scheme::environment> *)&proc.proc);
    environment::environment(this,&local_218);
    env_arg_it._M_current._7_1_ = 0;
    std::shared_ptr<implementations::scheme::environment>::
    shared_ptr<implementations::scheme::environment,void>
              ((shared_ptr<implementations::scheme::environment> *)local_208,this);
    std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_218);
    local_228._M_current =
         (cell *)std::
                 vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ::cbegin((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                           *)local_90);
    while( true ) {
      local_230._M_current =
           (cell *)std::
                   vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ::cend((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                           *)&proc.env.
                              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi[0xf]._M_use_count);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                          *)&frame_local,&local_230);
      if (!bVar2) break;
      this_00 = std::
                __shared_ptr_access<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_208);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator->(&local_228);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                            *)&frame_local);
      environment::define(this_00,&pcVar4->val,pcVar3);
      __gnu_cxx::
      __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_228);
      __gnu_cxx::
      __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                    *)&frame_local);
    }
    *(undefined4 *)
     &proc.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[0x13]._vptr__Sp_counted_base = 2;
    this_01 = (SchemeFrame *)operator_new(0x138);
    std::shared_ptr<implementations::scheme::environment>::shared_ptr
              (&local_240,(shared_ptr<implementations::scheme::environment> *)local_208);
    SchemeFrame::SchemeFrame
              (this_01,(cell *)&new_env.
                                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,&local_240);
    *(SchemeFrame **)
     &proc.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[0x12]._M_use_count = this_01;
    std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_240);
    it_local._M_current._7_1_ = 0;
    std::shared_ptr<implementations::scheme::environment>::~shared_ptr
              ((shared_ptr<implementations::scheme::environment> *)local_208);
    cell::~cell((cell *)&new_env.
                         super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *)
          local_90);
  cell::~cell((cell *)&args.
                       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(it_local._M_current._7_1_ & 1);
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		cell proc(*it); ++it;

		cells args;
		switch (proc.type) {
		// Proc: a builtin procedure in C++
		// We call this immediately. If it blocks, that is up
		// to the caller.
		case Proc:
			// Copy the rest of the resolved arguments to a new list,
			// that list is passed as the arguments.
			frame.result = proc.proc(cells(it, frame.resolved_arguments.cend()));
			return true;
		// Lambda: a Scheme procedure
		// We create a subframe to run the procedure, along with
		// an environment with arguments set to correct values.
		case Lambda:
		{
			// Arguments
			const cell &arglist = proc.list[1];
			switch (arglist.type) {
			case Symbol:
				// Single argument, assign all args as list
				args.push_back(arglist);
				// Convert resolved arguments to single list
				{
					cells tmp(frame.resolved_arguments);
					frame.resolved_arguments.clear();
					frame.resolved_arguments.push_back(tmp);
				}
				break;
			case List:
				// List of arguments
				args = arglist.list;
				break;
			}
			// Body
			const cell body = proc.list[2];
			// Create environment parented to lambda env
			env_p new_env(new environment(proc.env));
			auto env_arg_it = args.cbegin();
			// assign remaining arguments to our list of argument
			// names in new environment.
			for (; it != frame.resolved_arguments.cend(); ++env_arg_it, ++it) {
				DEBUG(std::string("    set lambda.") + env_arg_it->val + std::string(" = ") + to_string(*it));
				new_env->define(env_arg_it->val, *it);
			}
			// Create subframe
			frame.subframe_mode = SchemeFrame::Procedure;
			frame.subframe = new SchemeFrame(body, new_env);
			// Don't move exp_it
			return false;
		}
		default:
			throw std::runtime_error("Dont know how to run this proc");
		}
	}